

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

int lookup_uniforms(MOJOSHADER_glProgram *program,MOJOSHADER_glShader *shader,int *bound)

{
  MOJOSHADER_uniform *pMVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  MOJOSHADER_uniformType MVar5;
  MOJOSHADER_parseData *pMVar6;
  _func_int *p_Var7;
  MOJOSHADER_constant *pMVar8;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *p_Var9;
  UniformMap *pUVar10;
  _func_void_MOJOSHADER_glProgram_ptr *p_Var11;
  _func_void_MOJOSHADER_glProgram_ptr_MOJOSHADER_uniform_ptr_GLfloat_ptr *p_Var12;
  MOJOSHADER_sampler *pMVar13;
  void *pvVar14;
  MOJOSHADER_malloc p_Var15;
  undefined8 uVar16;
  MOJOSHADER_glShader *pMVar17;
  int iVar18;
  GLint GVar19;
  GLfloat *__s;
  GLint *pGVar20;
  GLfloat **ppGVar21;
  GLint **ppGVar22;
  size_t *psVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  MOJOSHADER_glShader **ppMVar31;
  MOJOSHADER_glShader *local_58;
  int *local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  ppMVar31 = &local_58;
  pMVar6 = shader->parseData;
  local_48 = (ulong)pMVar6->shader_type;
  local_58 = shader;
  local_50 = bound;
  if (pMVar6->uniform_count < 1) {
    local_38 = 0;
    local_3c = 0;
    local_34 = 0;
    ppMVar31 = &local_58;
  }
  else {
    lVar28 = 0;
    local_34 = 0;
    local_3c = 0;
    local_38 = 0;
    do {
      pMVar17 = local_58;
      pMVar1 = pMVar6->uniforms + lVar28;
      if (pMVar1->constant == 0) {
        p_Var9 = ctx->profileGetUniformLocation;
        *(undefined8 *)((long)ppMVar31 + -8) = 0x1279e4;
        GVar19 = (*p_Var9)(program,pMVar17,(int)lVar28);
        if (GVar19 != -1) {
          iVar18 = pMVar1->array_count;
          pUVar10 = program->uniforms;
          uVar25 = program->uniform_count;
          pUVar10[uVar25].shader_type = (MOJOSHADER_shaderType)local_48;
          pUVar10[uVar25].uniform = pMVar1;
          pUVar10[uVar25].location = GVar19;
          program->uniform_count = uVar25 + 1;
          MVar5 = pMVar1->type;
          if (MVar5 == MOJOSHADER_UNIFORM_BOOL) {
            local_38 = local_38 + iVar18 + (uint)(iVar18 == 0);
          }
          else if (MVar5 == MOJOSHADER_UNIFORM_INT) {
            local_3c = local_3c + iVar18 + (uint)(iVar18 == 0);
          }
          else {
            if (MVar5 != MOJOSHADER_UNIFORM_FLOAT) {
              *(undefined8 *)((long)ppMVar31 + -8) = 0x127ca4;
              __assert_fail("0 && \"Unexpected register type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x6a7,
                            "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                           );
            }
            local_34 = local_34 + iVar18 + (uint)(iVar18 == 0);
          }
        }
      }
      else {
        p_Var7 = ctx->profileMustPushConstantArrays;
        *(undefined8 *)((long)ppMVar31 + -8) = 0x127959;
        iVar18 = (*p_Var7)();
        if (iVar18 != 0) {
          iVar18 = pMVar1->array_count;
          ppMVar31 = (MOJOSHADER_glShader **)((long)ppMVar31 + (long)iVar18 * -0x10);
          if (pMVar6->constant_count < 1) {
            iVar24 = 0;
          }
          else {
            iVar3 = pMVar1->index;
            lVar26 = 0;
            lVar27 = 8;
            iVar24 = 0;
            do {
              pMVar8 = pMVar6->constants;
              if (*(int *)((long)pMVar8 + lVar27 + -8) == 0) {
                iVar4 = *(int *)((long)pMVar8 + lVar27 + -4);
                if ((iVar3 <= iVar4) && (iVar4 < iVar18 + iVar3)) {
                  puVar2 = (undefined8 *)((long)&pMVar8->type + lVar27);
                  uVar16 = puVar2[1];
                  *(undefined8 *)((long)ppMVar31 + (long)((iVar4 - iVar3) * 4) * 4) = *puVar2;
                  *(undefined8 *)((GLfloat *)((long)ppMVar31 + (long)((iVar4 - iVar3) * 4) * 4) + 2)
                       = uVar16;
                  iVar24 = iVar24 + 1;
                }
              }
              lVar26 = lVar26 + 1;
              lVar27 = lVar27 + 0x18;
            } while (lVar26 < pMVar6->constant_count);
          }
          if (iVar24 != iVar18) {
            *(GLfloat *)((long)ppMVar31 + -8) = 1.697708e-39;
            *(GLfloat *)((long)ppMVar31 + -4) = 0.0;
            __assert_fail("filled == size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x670,
                          "void fill_constant_array(GLfloat *, const int, const int, const MOJOSHADER_parseData *)"
                         );
          }
          if (*local_50 == 0) {
            p_Var11 = ctx->profileUseProgram;
            *(GLfloat *)((long)ppMVar31 + -8) = 1.696922e-39;
            *(GLfloat *)((long)ppMVar31 + -4) = 0.0;
            (*p_Var11)(program);
            *local_50 = 1;
          }
          p_Var12 = ctx->profilePushConstantArray;
          *(GLfloat *)((long)ppMVar31 + -8) = 1.696967e-39;
          *(GLfloat *)((long)ppMVar31 + -4) = 0.0;
          (*p_Var12)(program,pMVar1,(GLfloat *)ppMVar31);
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < pMVar6->uniform_count);
  }
  iVar18 = (int)local_48;
  uVar25 = local_34;
  if ((iVar18 == 1) && (iVar24 = pMVar6->sampler_count, 0 < (long)iVar24)) {
    pMVar13 = pMVar6->samplers;
    lVar28 = 0;
    do {
      if (*(int *)((long)&pMVar13->texbem + lVar28) != 0) {
        uVar25 = uVar25 + 2;
        program->texbem_count = program->texbem_count + 1;
      }
      lVar28 = lVar28 + 0x18;
    } while ((long)iVar24 * 0x18 != lVar28);
  }
  if (uVar25 != 0) {
    sVar30 = (ulong)uVar25 << 4;
    pvVar14 = ctx->malloc_data;
    p_Var15 = ctx->malloc_fn;
    *(undefined8 *)((long)ppMVar31 + -8) = 0x127b08;
    __s = (GLfloat *)(*p_Var15)((int)sVar30,pvVar14);
    if (__s == (GLfloat *)0x0) {
      builtin_strncpy(error_buffer,"out of memory",0xe);
      return 0;
    }
    if (1 < iVar18 - 1U) {
      *(undefined8 *)((long)ppMVar31 + -8) = 0x127cc3;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6ca,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar21 = &program->ps_uniforms_float4;
    if (iVar18 == 2) {
      ppGVar21 = &program->vs_uniforms_float4;
    }
    *ppGVar21 = __s;
    psVar23 = &program->vs_uniforms_float4_count;
    if (iVar18 != 2) {
      psVar23 = &program->ps_uniforms_float4_count;
    }
    *psVar23 = (ulong)uVar25;
    *(undefined8 *)((long)ppMVar31 + -8) = 0x127b4e;
    memset(__s,0,sVar30);
  }
  if (local_3c != 0) {
    uVar29 = (ulong)local_3c;
    sVar30 = uVar29 << 4;
    pvVar14 = ctx->malloc_data;
    p_Var15 = ctx->malloc_fn;
    *(undefined8 *)((long)ppMVar31 + -8) = 0x127b6f;
    pGVar20 = (GLint *)(*p_Var15)((int)sVar30,pvVar14);
    if (pGVar20 == (GLint *)0x0) {
      builtin_strncpy(error_buffer,"out of memory",0xe);
      return 0;
    }
    if (1 < iVar18 - 1U) {
      *(undefined8 *)((long)ppMVar31 + -8) = 0x127ce2;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6cb,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar22 = &program->ps_uniforms_int4;
    if (iVar18 == 2) {
      ppGVar22 = &program->vs_uniforms_int4;
    }
    *ppGVar22 = pGVar20;
    psVar23 = &program->vs_uniforms_int4_count;
    if (iVar18 != 2) {
      psVar23 = &program->ps_uniforms_int4_count;
    }
    *psVar23 = uVar29;
    *(undefined8 *)((long)ppMVar31 + -8) = 0x127bb8;
    memset(pGVar20,0,sVar30);
  }
  if (local_38 == 0) {
    return 1;
  }
  uVar29 = (ulong)local_38;
  sVar30 = uVar29 * 4;
  pvVar14 = ctx->malloc_data;
  p_Var15 = ctx->malloc_fn;
  *(undefined8 *)((long)ppMVar31 + -8) = 0x127be4;
  pGVar20 = (GLint *)(*p_Var15)((int)sVar30,pvVar14);
  if (pGVar20 == (GLint *)0x0) {
    builtin_strncpy(error_buffer,"out of memory",0xe);
    return 0;
  }
  iVar18 = (int)local_48;
  if (1 < iVar18 - 1U) {
    *(code **)((long)ppMVar31 + -8) = lookup_samplers;
    __assert_fail("0 && \"unsupported shader type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x6cc,"int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                 );
  }
  ppGVar22 = &program->ps_uniforms_bool;
  if (iVar18 == 2) {
    ppGVar22 = &program->vs_uniforms_bool;
  }
  *ppGVar22 = pGVar20;
  psVar23 = &program->vs_uniforms_bool_count;
  if (iVar18 != 2) {
    psVar23 = &program->ps_uniforms_bool_count;
  }
  *psVar23 = uVar29;
  *(undefined8 *)((long)ppMVar31 + -8) = 0x127c2d;
  memset(pGVar20,0,sVar30);
  return 1;
}

Assistant:

static int lookup_uniforms(MOJOSHADER_glProgram *program,
                           MOJOSHADER_glShader *shader, int *bound)
{
    const MOJOSHADER_parseData *pd = shader->parseData;
    const MOJOSHADER_shaderType shader_type = pd->shader_type;
    uint32 float4_count = 0;
    uint32 int4_count = 0;
    uint32 bool_count = 0;
    int i;

    for (i = 0; i < pd->uniform_count; i++)
    {
        const MOJOSHADER_uniform *u = &pd->uniforms[i];

        if (u->constant)
        {
            // only do constants once, at link time. These aren't changed ever.
            if (ctx->profileMustPushConstantArrays())
            {
                const int base = u->index;
                const int size = u->array_count;
                GLfloat *f = (GLfloat *) alloca(sizeof (GLfloat) * (size * 4));
                fill_constant_array(f, base, size, pd);
                if (!(*bound))
                {
                    ctx->profileUseProgram(program);
                    *bound = 1;
                } // if
                ctx->profilePushConstantArray(program, u, f);
            } // if
        } // if

        else
        {
            const GLint loc = ctx->profileGetUniformLocation(program, shader, i);
            if (loc != -1)  // -1 means it was optimized out, or failure.
            {
                const int regcount = u->array_count;
                UniformMap *map = &program->uniforms[program->uniform_count];
                map->shader_type = shader_type;
                map->uniform = u;
                map->location = (GLuint) loc;
                program->uniform_count++;

                if (u->type == MOJOSHADER_UNIFORM_FLOAT)
                    float4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_INT)
                    int4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_BOOL)
                    bool_count += regcount ? regcount : 1;
                else
                    assert(0 && "Unexpected register type");
            } // if
        } // else
    } // for

    if (shader_type == MOJOSHADER_TYPE_PIXEL)
    {
        for (i = 0; i < pd->sampler_count; i++)
        {
            if (pd->samplers[i].texbem)
            {
                float4_count += 2;
                program->texbem_count++;
            } // if
        } // for
    } // if

    #define MAKE_ARRAY(typ, gltyp, siz, count) \
        if (count) { \
            const size_t buflen = sizeof (gltyp) * siz * count; \
            gltyp *ptr = (gltyp *) Malloc(buflen); \
            if (ptr == NULL) { \
                return 0; \
            } else if (shader_type == MOJOSHADER_TYPE_VERTEX) { \
                program->vs_uniforms_##typ = ptr; \
                program->vs_uniforms_##typ##_count = count; \
            } else if (shader_type == MOJOSHADER_TYPE_PIXEL) { \
                program->ps_uniforms_##typ = ptr; \
                program->ps_uniforms_##typ##_count = count; \
            } else { \
                assert(0 && "unsupported shader type"); \
            } \
            memset(ptr, '\0', buflen); \
        }

    MAKE_ARRAY(float4, GLfloat, 4, float4_count);
    MAKE_ARRAY(int4, GLint, 4, int4_count);
    MAKE_ARRAY(bool, GLint, 1, bool_count);

    #undef MAKE_ARRAY

    return 1;
}